

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

string * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
copyString_abi_cxx11_(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  uint8_t *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  char *msg;
  string *in_RDI;
  ValueLength length_1;
  ValueLength length;
  uint8_t h;
  allocator<char> *in_stack_ffffffffffffff68;
  Exception *in_stack_ffffffffffffff70;
  unsigned_long __n;
  char *in_stack_ffffffffffffff78;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_49;
  unsigned_long local_48;
  allocator<char> local_29;
  long local_28;
  byte local_19;
  unsigned_long local_8;
  
  local_19 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::head
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        0x12a5c6);
  if ((local_19 < 0x40) || (0xbe < local_19)) {
    if (local_19 != 0xbf) {
      msg = (char *)__cxa_allocate_exception(0x18);
      Exception::Exception
                (in_stack_ffffffffffffff70,(ExceptionType)((ulong)in_stack_ffffffffffffff68 >> 0x20)
                 ,msg);
      __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
    }
    puVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        0x12a698);
    local_48 = readIntegerFixed<unsigned_long,8ul>(puVar1 + 1);
    puVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        0x12a6b2);
    __a = (allocator<char> *)(puVar1 + 9);
    local_8 = local_48;
    __s = &local_49;
    __n = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_stack_ffffffffffffff80,(char *)__s,__n,__a);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    local_28 = (long)(int)(local_19 - 0x40);
    puVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        0x12a610);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (this_00,in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    std::allocator<char>::~allocator(&local_29);
  }
  return in_RDI;
}

Assistant:

std::string copyString() const {
    uint8_t h = head();
    if (h >= 0x40 && h <= 0xbe) {
      // short UTF-8 String
      ValueLength length = h - 0x40;
      return std::string(reinterpret_cast<char const*>(start() + 1),
                         static_cast<std::size_t>(length));
    }

    if (h == 0xbf) {
      ValueLength length = readIntegerFixed<ValueLength, 8>(start() + 1);
      return std::string(reinterpret_cast<char const*>(start() + 1 + 8),
                         checkOverflow(length));
    }

    throw Exception(Exception::InvalidValueType, "Expecting type String");
  }